

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O1

int isearch(int dir)

{
  long lVar1;
  int iVar2;
  line *plVar3;
  bool bVar4;
  mgwin *pmVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  size_t sVar11;
  ushort **ppuVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  byte bVar18;
  undefined1 local_c8 [8];
  char opat [80];
  line *local_58;
  int local_3c;
  uint local_38;
  int dir_local;
  
  local_3c = dir;
  if (macrodef != 0) {
    dobeep();
    ewprintf("Can\'t isearch in macro");
    return 0;
  }
  lVar10 = 0;
  do {
    *(undefined4 *)((long)&cmds[0].s_code + lVar10) = 0xfffffffd;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0xc00);
  cip = 0x80;
  strlcpy(local_c8,pat,0x50);
  local_38 = 0xffffffff;
  local_58 = curwp->w_dotp;
  iVar14 = curwp->w_doto;
  iVar2 = curwp->w_dotline;
  cip = 1;
  cmds[1].s_code = 0;
  cmds[1].s_dotp = local_58;
  cmds[1].s_doto = iVar14;
  cmds[1].s_dotline = iVar2;
  is_prompt(dir,1,1);
  dir_local = 1;
LAB_001172d4:
  update(2);
  uVar7 = getkey(0);
  iVar8 = local_3c;
  pmVar5 = curwp;
  iVar17 = dir_local;
  switch(uVar7) {
  case 7:
    if (dir_local == 1) {
      curwp->w_dotp = local_58;
      pmVar5->w_doto = iVar14;
      pmVar5->w_dotline = iVar2;
      pmVar5->w_rflag = pmVar5->w_rflag | 2;
      srch_lastdir = local_3c;
      ctrlg(8,0);
      strlcpy(pat,local_c8,0x50);
      return 2;
    }
    iVar8 = cmds[cip].s_code;
    while (iVar8 == -4) {
      is_undo((int *)&local_38,&local_3c);
      iVar8 = cmds[cip].s_code;
    }
    dir_local = 1;
    is_prompt(local_3c,local_38 >> 0x1f,1);
    goto LAB_001172d4;
  case 8:
    goto switchD_00117307_caseD_8;
  case 9:
  case 10:
    break;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
switchD_00117307_caseD_b:
    if ((cinfo[uVar7 & 0xff] & 8U) != 0) {
      ungetkey(uVar7);
      pmVar5 = curwp;
      curwp->w_markp = local_58;
      pmVar5->w_marko = iVar14;
      pmVar5->w_markline = iVar2;
      ewprintf("Mark set");
      curwp->w_rflag = curwp->w_rflag | 2;
      return 1;
    }
    break;
  case 0x11:
  case 0x1c:
    iVar8 = getkey(0);
    uVar7 = (uint)(char)iVar8;
    break;
  case 0x12:
    if (local_3c == -1) {
      local_3c = -2;
      iVar8 = cip + 1;
      if (0x7e < cip) {
        iVar8 = 0;
      }
      cmds[iVar8].s_code = -3;
      pmVar5 = curwp;
      cmds[iVar8].s_doto = curwp->w_doto;
      cmds[iVar8].s_dotp = pmVar5->w_dotp;
      cmds[iVar8].s_dotline = pmVar5->w_dotline;
      cip = iVar8;
      cmds[iVar8].s_code = -2;
      iVar17 = 1;
    }
    iVar8 = local_3c;
    pmVar5 = curwp;
    if (local_3c == -2 && iVar17 == 0) {
      plVar3 = curbp->b_headp->l_bp;
      curwp->w_dotp = plVar3;
      pmVar5->w_doto = plVar3->l_used;
      pmVar5->w_dotline = pmVar5->w_bufp->b_lines;
      goto LAB_0011764e;
    }
    iVar9 = cip + 1;
    if (0x7e < cip) {
      iVar9 = 0;
    }
    cmds[iVar9].s_code = -3;
    pmVar5 = curwp;
    cmds[iVar9].s_doto = curwp->w_doto;
    cmds[iVar9].s_dotp = pmVar5->w_dotp;
    cmds[iVar9].s_dotline = pmVar5->w_dotline;
    sVar11 = strlen(pat);
    uVar7 = (uint)sVar11;
    local_38 = uVar7;
    iVar9 = backchar(8,1);
    if (iVar9 != 0) {
      iVar9 = is_find(-2);
      if (iVar9 != 0) {
        iVar9 = cip + 1;
        if (0x7e < cip) {
          iVar9 = 0;
        }
        cip = iVar9;
        cmds[iVar9].s_code = -5;
        goto LAB_001179df;
      }
      forwchar(8,1);
    }
    dobeep();
    iVar17 = 0;
LAB_001179df:
    dir_local = iVar17;
    is_prompt(iVar8,uVar7 >> 0x1f,iVar17);
    goto LAB_001172d4;
  case 0x13:
    if (local_3c == -2) {
      local_3c = -1;
      iVar8 = cip + 1;
      if (0x7e < cip) {
        iVar8 = 0;
      }
      cmds[iVar8].s_code = -3;
      pmVar5 = curwp;
      cmds[iVar8].s_doto = curwp->w_doto;
      cmds[iVar8].s_dotp = pmVar5->w_dotp;
      cmds[iVar8].s_dotline = pmVar5->w_dotline;
      cip = iVar8;
      cmds[iVar8].s_code = -1;
      iVar17 = 1;
    }
    iVar8 = local_3c;
    pmVar5 = curwp;
    if (local_3c != -1 || iVar17 != 0) {
      iVar9 = cip + 1;
      if (0x7e < cip) {
        iVar9 = 0;
      }
      cmds[iVar9].s_code = -3;
      pmVar5 = curwp;
      cmds[iVar9].s_doto = curwp->w_doto;
      cmds[iVar9].s_dotp = pmVar5->w_dotp;
      cmds[iVar9].s_dotline = pmVar5->w_dotline;
      sVar11 = strlen(pat);
      uVar7 = (uint)sVar11;
      local_38 = uVar7;
      iVar9 = forwchar(8,1);
      if (iVar9 == 0) {
        dobeep();
      }
      else {
        iVar9 = is_find(-1);
        if (iVar9 != 0) {
          iVar9 = cip + 1;
          if (0x7e < cip) {
            iVar9 = 0;
          }
          cip = iVar9;
          cmds[iVar9].s_code = -5;
          goto LAB_001179df;
        }
        backchar(8,1);
        dobeep();
      }
      iVar17 = 0;
      ewprintf("Failed I-search: %s",pat);
      goto LAB_001179df;
    }
    curwp->w_dotp = curbp->b_headp->l_fp;
    pmVar5->w_doto = 0;
    pmVar5->w_dotline = 1;
LAB_0011764e:
    iVar8 = is_find(local_3c);
    if (iVar8 == 0) {
      dir_local = 0;
    }
    else {
      iVar8 = cip + 1;
      if (0x7e < cip) {
        iVar8 = 0;
      }
      cip = iVar8;
      cmds[iVar8].s_code = -5;
      dir_local = 1;
    }
    ewprintf("Overwrapped I-search: %s");
    goto LAB_001172d4;
  case 0x17:
    goto switchD_00117307_caseD_17;
  case 0x1b:
    iVar8 = ttwait(300);
    if (iVar8 == 0) {
      ungetkey(0x1b);
    }
  case 0xd:
    pmVar5 = curwp;
    srch_lastdir = local_3c;
    curwp->w_markp = local_58;
    pmVar5->w_marko = iVar14;
    pmVar5->w_markline = iVar2;
    ewprintf("Mark set");
    return 1;
  default:
    if (uVar7 != 0x7f) goto switchD_00117307_caseD_b;
    goto switchD_00117307_caseD_8;
  }
  uVar15 = local_38;
  if (local_38 == 0xffffffff) {
    uVar15 = 0;
  }
  if (uVar15 == 0x4f) {
    local_38 = uVar15;
    dobeep();
  }
  else {
    local_38 = uVar15 + 1;
    pat[(int)uVar15] = (char)uVar7;
    pat[(long)(int)uVar15 + 1] = '\0';
  }
  iVar8 = cip + 1;
  if (0x7e < cip) {
    iVar8 = 0;
  }
  cmds[iVar8].s_code = -3;
  pmVar5 = curwp;
  cmds[iVar8].s_doto = curwp->w_doto;
  cmds[iVar8].s_dotp = pmVar5->w_dotp;
  cmds[iVar8].s_dotline = pmVar5->w_dotline;
  if ((uVar15 == 0) || (dir_local != 0)) {
    iVar8 = is_find(local_3c);
    if (iVar8 == 0) {
      dobeep();
      iVar8 = cip + 1;
      if (0x7e < cip) {
        iVar8 = 0;
      }
      dir_local = 0;
      cip = iVar8;
      cmds[iVar8].s_code = -4;
    }
    else {
      iVar8 = cip + 1;
      if (0x7e < cip) {
        iVar8 = 0;
      }
      cip = iVar8;
      cmds[iVar8].s_code = uVar7;
      dir_local = 1;
    }
  }
  else {
    cip = iVar8;
    cmds[iVar8].s_code = -4;
    dir_local = 0;
  }
  uVar7 = 0;
LAB_001176c1:
  is_prompt(local_3c,uVar7,dir_local);
  goto LAB_001172d4;
switchD_00117307_caseD_17:
  uVar7 = local_38;
  if (local_38 == 0xffffffff) {
    uVar7 = 0;
  }
  uVar15 = 0;
  if (local_3c == -2) {
    uVar15 = uVar7;
  }
  iVar14 = uVar15 + curwp->w_doto;
  local_58 = curwp->w_dotp;
  if (pat[0] == '\0') {
    bVar4 = true;
  }
  else {
    pcVar13 = pat;
    bVar4 = false;
    bVar18 = pat[0];
    do {
      pcVar13 = (char *)((byte *)pcVar13 + 1);
      if ((cinfo[bVar18] & 2U) != 0) {
        bVar4 = true;
      }
      bVar18 = *pcVar13;
    } while (bVar18 != 0);
    bVar4 = !bVar4;
  }
  local_38 = uVar7;
  if (iVar14 < local_58->l_used) {
    lVar10 = (long)(int)uVar7;
    opat._72_8_ = 0x4f - lVar10;
    lVar16 = 0;
    bVar6 = false;
    do {
      bVar18 = local_58->l_text[lVar16 + iVar14];
      iVar17 = (int)lVar16;
      if ((bVar6) && (ppuVar12 = __ctype_b_loc(), ((*ppuVar12)[bVar18] & 8) == 0)) {
        iVar14 = iVar14 + iVar17 + 1;
        goto LAB_001179fd;
      }
      if (opat._72_8_ == lVar16) {
        iVar14 = iVar14 + iVar17 + 1;
        local_38 = 0x4f;
        dobeep();
        goto LAB_00117a1f;
      }
      if (bVar4) {
        bVar18 = bVar18 + (cinfo[bVar18] & 2U) * '\x10';
      }
      pat[lVar16 + lVar10] = bVar18;
      pat[lVar16 + lVar10 + 1] = '\0';
      pmVar5 = curwp;
      if (iVar8 == -1) {
        curwp->w_doto = iVar14 + iVar17 + 1;
        pmVar5->w_rflag = pmVar5->w_rflag | 2;
        update(2);
      }
      lVar1 = iVar14 + lVar16;
      lVar16 = lVar16 + 1;
      bVar6 = true;
    } while (lVar1 + 1 < (long)local_58->l_used);
    iVar14 = iVar14 + (int)lVar16;
LAB_001179fd:
    local_38 = (int)lVar16 + uVar7;
  }
LAB_00117a1f:
  is_prompt(iVar8,local_38 >> 0x1f,dir_local);
  goto LAB_001172d4;
switchD_00117307_caseD_8:
  is_undo((int *)&local_38,&local_3c);
  if (cmds[cip].s_code != -4) {
    dir_local = 1;
  }
  uVar7 = local_38 >> 0x1f;
  goto LAB_001176c1;
}

Assistant:

static int
isearch(int dir)
{
	struct line	*clp;		/* Saved line pointer */
	int		 c;
	int		 cbo;		/* Saved offset */
	int		 success;
	int		 pptr;
	int		 firstc;
	int		 xcase;
	int		 i;
	char		 opat[NPAT];
	int		 cdotline;	/* Saved line number */

	if (macrodef) {
		dobeep();
		ewprintf("Can't isearch in macro");
		return (FALSE);
	}
	for (cip = 0; cip < NSRCH; cip++)
		cmds[cip].s_code = SRCH_NOPR;

	(void)strlcpy(opat, pat, sizeof(opat));
	cip = 0;
	pptr = -1;
	clp = curwp->w_dotp;
	cbo = curwp->w_doto;
	cdotline = curwp->w_dotline;
	is_lpush();
	is_cpush(SRCH_BEGIN);
	success = TRUE;
	is_prompt(dir, TRUE, success);

	for (;;) {
		update(CMODE);

		switch (c = getkey(FALSE)) {
		case CCHR('['):
			/*
			 * If new characters come in the next 300 msec,
			 * we can assume that they belong to a longer
			 * escaped sequence so we should ungetkey the
			 * ESC to avoid writing out garbage.
			 */
			if (ttwait(300) == FALSE)
				ungetkey(c);
			/* FALLTHRU */
		case CCHR('M'):
			srch_lastdir = dir;
			curwp->w_markp = clp;
			curwp->w_marko = cbo;
			curwp->w_markline = cdotline;
			ewprintf("Mark set");
			return (TRUE);
		case CCHR('G'):
			if (success != TRUE) {
				while (is_peek() == SRCH_ACCM)
					is_undo(&pptr, &dir);
				success = TRUE;
				is_prompt(dir, pptr < 0, success);
				break;
			}
			curwp->w_dotp = clp;
			curwp->w_doto = cbo;
			curwp->w_dotline = cdotline;
			curwp->w_rflag |= WFMOVE;
			srch_lastdir = dir;
			(void)ctrlg(FFRAND, 0);
			(void)strlcpy(pat, opat, sizeof(pat));
			return (ABORT);
		case CCHR('S'):
			if (dir == SRCH_BACK) {
				dir = SRCH_FORW;
				is_lpush();
				is_cpush(SRCH_FORW);
				success = TRUE;
			}
			if (success == FALSE && dir == SRCH_FORW) {
				/* wrap the search to beginning */
				curwp->w_dotp = bfirstlp(curbp);
				curwp->w_doto = 0;
				curwp->w_dotline = 1;
				if (is_find(dir) != FALSE) {
					is_cpush(SRCH_MARK);
					success = TRUE;
				}
				ewprintf("Overwrapped I-search: %s", pat);
				break;
			}
			is_lpush();
			pptr = strlen(pat);
			if (forwchar(FFRAND, 1) == FALSE) {
                                dobeep();
                                success = FALSE;
                                ewprintf("Failed I-search: %s", pat);
			} else {
				if (is_find(SRCH_FORW) != FALSE)
					is_cpush(SRCH_MARK);
				else {
					(void)backchar(FFRAND, 1);
					dobeep();
					success = FALSE;
					ewprintf("Failed I-search: %s", pat);
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('R'):
			if (dir == SRCH_FORW) {
				dir = SRCH_BACK;
				is_lpush();
				is_cpush(SRCH_BACK);
				success = TRUE;
			}
			if (success == FALSE && dir == SRCH_BACK) {
				/* wrap the search to end */
				curwp->w_dotp = blastlp(curbp);
				curwp->w_doto = llength(curwp->w_dotp);
				curwp->w_dotline = curwp->w_bufp->b_lines;
				if (is_find(dir) != FALSE) {
					is_cpush(SRCH_MARK);
					success = TRUE;
				}
				ewprintf("Overwrapped I-search: %s", pat);
				break;
			}
			is_lpush();
			pptr = strlen(pat);
                        if (backchar(FFRAND, 1) == FALSE) {
                                dobeep();
                                success = FALSE;
                        } else {
				if (is_find(SRCH_BACK) != FALSE)
					is_cpush(SRCH_MARK);
				else {
					(void)forwchar(FFRAND, 1);
					dobeep();
					success = FALSE;
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('W'):
			/* add the rest of the current word to the pattern */
			clp = curwp->w_dotp;
			cbo = curwp->w_doto;
			firstc = 1;
			if (pptr == -1)
				pptr = 0;
			if (dir == SRCH_BACK) {
				/* when isearching backwards, cbo is the start of the pattern */
				cbo += pptr;
			}

			/* if the search is case insensitive, add to pattern using lowercase */
			xcase = 0;
			for (i = 0; pat[i]; i++)
				if (ISUPPER(CHARMASK(pat[i])))
					xcase = 1;

			while (cbo < llength(clp)) {
				c = lgetc(clp, cbo++);
				if ((!firstc && !isalnum(c)))
					break;

				if (pptr == NPAT - 1) {
					dobeep();
					break;
				}
				firstc = 0;
				if (!xcase && ISUPPER(c))
					c = TOLOWER(c);

				pat[pptr++] = c;
				pat[pptr] = '\0';
				/* cursor only moves when isearching forwards */
				if (dir == SRCH_FORW) {
					curwp->w_doto = cbo;
					curwp->w_rflag |= WFMOVE;
					update(CMODE);
				}
			}
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('H'):
		case CCHR('?'):
			is_undo(&pptr, &dir);
			if (is_peek() != SRCH_ACCM)
				success = TRUE;
			is_prompt(dir, pptr < 0, success);
			break;
		case CCHR('\\'):
		case CCHR('Q'):
			c = (char)getkey(FALSE);
			goto addchar;
		default:
			if (ISCTRL(c)) {
				ungetkey(c);
				curwp->w_markp = clp;
				curwp->w_marko = cbo;
				curwp->w_markline = cdotline;
				ewprintf("Mark set");
				curwp->w_rflag |= WFMOVE;
				return (TRUE);
			}
			/* FALLTHRU */
		case CCHR('I'):
		case CCHR('J'):
	addchar:
			if (pptr == -1)
				pptr = 0;
			if (pptr == 0)
				success = TRUE;
			if (pptr == NPAT - 1)
				dobeep();
			else {
				pat[pptr++] = c;
				pat[pptr] = '\0';
			}
			is_lpush();
			if (success != FALSE) {
				if (is_find(dir) != FALSE)
					is_cpush(c);
				else {
					success = FALSE;
					dobeep();
					is_cpush(SRCH_ACCM);
				}
			} else
				is_cpush(SRCH_ACCM);
			is_prompt(dir, FALSE, success);
		}
	}
	/* NOTREACHED */
}